

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_intern(sexp ctx,char *str,sexp_sint_t len)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  sexp psVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_50;
  sexp_gc_var_t local_48;
  
  local_50 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (len < 0) {
    len = strlen(str);
  }
  if ((sexp)len != (sexp)0x0) {
    ppuVar3 = __ctype_b_loc();
    bVar1 = *str;
    if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
      if (bVar1 == 0x2b) {
        if (len < 2) {
LAB_0010f295:
          if (len < 1) {
            return (sexp)0x6;
          }
          uVar10 = 0;
          psVar4 = (sexp)0x0;
          uVar6 = 4;
          while (bVar1 = str[(long)psVar4], ' ' < (char)bVar1) {
            if ((((bVar1 - 0x23 < 0x3a) &&
                 ((0x200000000000801U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) != 0)) ||
                (bVar1 == 0x7c)) ||
               ((""[bVar1] != '\0' || (uVar9 = huff_table[bVar1].len + uVar6, 0x40 < uVar9))))
            break;
            uVar10 = uVar10 | (ulong)huff_table[bVar1].bits << ((byte)uVar6 & 0x3f);
            psVar4 = (sexp)((long)&psVar4->tag + 1);
            uVar6 = uVar9;
            if ((sexp)len == psVar4) {
              return (sexp)(uVar10 + 6);
            }
          }
          pcVar7 = str + (long)psVar4;
          goto LAB_0010f34c;
        }
      }
      else if (len < 2 || bVar1 != 0x2d) goto LAB_0010f295;
    }
  }
  psVar4 = (sexp)0x0;
  uVar10 = 0;
  pcVar7 = str;
LAB_0010f34c:
  if ((sexp)len != psVar4) {
    lVar5 = 0;
    do {
      uVar10 = (long)pcVar7[lVar5] ^ uVar10 * 0x1000193;
      lVar5 = lVar5 + 1;
    } while (len - (long)psVar4 != lVar5);
  }
  piVar8 = *(int **)((long)&((((ctx->value).type.setters)->value).type.cpl)->value +
                    (uVar10 % 0x185) * 8 + 8);
  while( true ) {
    if ((((ulong)piVar8 & 3) != 0) || (*piVar8 != 6)) {
      local_48.var = &local_50;
      local_48.next = (ctx->value).context.saves;
      (ctx->value).context.saves = &local_48;
      local_50 = sexp_c_string(ctx,str,len);
      if ((((ulong)local_50 & 3) != 0) || (local_50->tag != 0x13)) {
        local_50 = (local_50->value).type.name;
        local_50->tag = 7;
        sexp_push_op(ctx,(sexp_conflict *)
                         ((long)&((((ctx->value).type.setters)->value).type.cpl)->value +
                         (uVar10 % 0x185) * 8 + 8),local_50);
        (ctx->value).context.saves = local_48.next;
      }
      return local_50;
    }
    psVar4 = *(sexp *)(piVar8 + 2);
    if (((psVar4->value).type.name == (sexp)len) &&
       (iVar2 = strncmp(str,(psVar4->value).flonum_bits + 8,len), iVar2 == 0)) break;
    piVar8 = *(int **)(piVar8 + 4);
  }
  return psVar4;
}

Assistant:

sexp sexp_intern(sexp ctx, const char *str, sexp_sint_t len) {
#if SEXP_USE_HUFF_SYMS
  struct sexp_huff_entry he;
  sexp_sint_t space, newbits;
  char c;
#endif
  sexp ls, tmp;
  sexp_gc_var1(sym);
  sexp_sint_t bucket=0;
#if (SEXP_USE_HASH_SYMS || SEXP_USE_HUFF_SYMS)
  sexp_sint_t i=0, res=FNV_OFFSET_BASIS;
  const char *p=str;
#endif

  if (len < 0) len = strlen(str);

#if SEXP_USE_HUFF_SYMS
  res = 0;
  space = SEXP_IMMEDIATE_BITS;
  if (len == 0 || sexp_isdigit((unsigned char)p[0])
      || ((p[0] == '+' || p[0] == '-') && len > 1))
    goto normal_intern;
  for ( ; i<len; i++, p++) {
    c = *p;
    if ((unsigned char)c <= 32 || (unsigned char)c > 127 || c == '\\' || c == '|' || c == '.' || c =='#' || sexp_is_separator(c))
      goto normal_intern;
    he = huff_table[(unsigned char)c];
    newbits = he.len;
    if ((space+newbits) > (sizeof(sexp)*8))
      goto normal_intern;
    res |= (((sexp_uint_t) he.bits) << space);
    space += newbits;
  }
  return (sexp) (res + SEXP_ISYMBOL_TAG);

 normal_intern:
#endif
#if SEXP_USE_HASH_SYMS
  bucket = (sexp_string_hash(p, len-i, res) % SEXP_SYMBOL_TABLE_SIZE);
#endif
  for (ls=sexp_context_symbols(ctx)[bucket]; sexp_pairp(ls); ls=sexp_cdr(ls))
    if ((sexp_lsymbol_length(tmp=sexp_car(ls)) == len)
        && ! strncmp(str, sexp_lsymbol_data(tmp), len))
      return sexp_car(ls);

  /* not found, make a new symbol */
  sexp_gc_preserve1(ctx, sym);
  sym = sexp_c_string(ctx, str, len);
  if (sexp_exceptionp(sym)) return sym;
#if ! SEXP_USE_PACKED_STRINGS
  sym = sexp_string_bytes(sym);
#endif
  sexp_pointer_tag(sym) = SEXP_SYMBOL;
  sexp_push(ctx, sexp_context_symbols(ctx)[bucket], sym);
  sexp_gc_release1(ctx);
  return sym;
}